

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O1

void __thiscall QWidgetRepaintManager::removeDirtyWidget(QWidgetRepaintManager *this,QWidget *w)

{
  long lVar1;
  QWidget *w_00;
  QWidgetRepaintManager *this_00;
  ulong uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  QWidget *local_38;
  anon_class_8_1_54a39814_for__M_pred local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (w != (QWidget *)0x0) {
    local_38 = w;
    local_30.t = (QWindow **)&local_38;
    QtPrivate::
    sequential_erase_if<QList<QWidget*>,QtPrivate::sequential_erase<QList<QWidget*>,QWidget*>(QList<QWidget*>&,QWidget*const&)::_lambda(auto:1_const&)_1_>
              ((QList<QWidget_*> *)(this + 0x18),&local_30);
    this_00 = this + 0x30;
    local_38 = w;
    local_30.t = (QWindow **)&local_38;
    QtPrivate::
    sequential_erase_if<QList<QWidget*>,QtPrivate::sequential_erase<QList<QWidget*>,QWidget*>(QList<QWidget*>&,QWidget*const&)::_lambda(auto:1_const&)_1_>
              ((QList<QWidget_*> *)this_00,&local_30);
    resetWidget(this_00,w);
    local_38 = w;
    local_30.t = (QWindow **)&local_38;
    QtPrivate::
    sequential_erase_if<QList<QWidget*>,QtPrivate::sequential_erase<QList<QWidget*>,QWidget*>(QList<QWidget*>&,QWidget*const&)::_lambda(auto:1_const&)_1_>
              ((QList<QWidget_*> *)(this + 0x50),&local_30);
    lVar1 = *(long *)&w->field_0x8;
    uVar3 = (uint)*(undefined8 *)(lVar1 + 0x28);
    if (0 < (int)uVar3) {
      uVar2 = 0;
      do {
        w_00 = *(QWidget **)(*(long *)(lVar1 + 0x20) + uVar2 * 8);
        if ((w_00 == (QWidget *)0x0) || ((*(byte *)(*(long *)&w_00->field_0x8 + 0x30) & 1) == 0)) {
          w_00 = (QWidget *)0x0;
        }
        if (w_00 != (QWidget *)0x0) {
          removeDirtyWidget(this,w_00);
        }
        uVar2 = uVar2 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::removeDirtyWidget(QWidget *w)
{
    if (!w)
        return;

    dirtyWidgets.removeAll(w);
    dirtyRenderToTextureWidgets.removeAll(w);
    resetWidget(w);

    needsFlushWidgets.removeAll(w);

    QWidgetPrivate *wd = w->d_func();
    const int n = wd->children.size();
    for (int i = 0; i < n; ++i) {
        if (QWidget *child = qobject_cast<QWidget*>(wd->children.at(i)))
            removeDirtyWidget(child);
    }
}